

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall leveldb::Arena::~Arena(Arena *this)

{
  pointer ppcVar1;
  char *pcVar2;
  size_t i;
  ulong uVar3;
  
  for (uVar3 = 0;
      ppcVar1 = (this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3);
      uVar3 = uVar3 + 1) {
    pcVar2 = ppcVar1[uVar3];
    if (pcVar2 != (char *)0x0) {
      operator_delete__(pcVar2);
    }
  }
  std::_Vector_base<char_*,_std::allocator<char_*>_>::~_Vector_base
            (&(this->blocks_).super__Vector_base<char_*,_std::allocator<char_*>_>);
  return;
}

Assistant:

Arena::~Arena() {
  for (size_t i = 0; i < blocks_.size(); i++) {
    delete[] blocks_[i];
  }
}